

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O1

int __thiscall KParser::_cmp_expr(KParser *this,int begin,BlockInfo *bi)

{
  TokenType TVar1;
  pointer pTVar2;
  pointer pcVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string leftValue;
  string rightValue;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 local_2f0 [32];
  _Alloc_hider local_2d0;
  char local_2c0 [16];
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  char local_40 [16];
  
  pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_330[0] = local_320;
  _Var5._M_p = pTVar2[begin].str._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_330,_Var5._M_p,_Var5._M_p + pTVar2[begin].str._M_string_length);
  pcVar3 = (bi->sLabel)._M_dataplus._M_p;
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar3,pcVar3 + (bi->sLabel)._M_string_length);
  pcVar3 = (bi->eLabel)._M_dataplus._M_p;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (bi->eLabel)._M_string_length);
  uVar4 = _add_expr(this,begin,(BlockInfo *)local_70);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((int)uVar4 < 0) {
    uVar4 = 0xffffffff;
    goto LAB_0010d227;
  }
  pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar1 = pTVar2[uVar4].tokenType;
  if (TVar1 - plus < 0xfffffffa) goto LAB_0010d227;
  uVar6 = uVar4 + 1;
  local_310[0] = local_300;
  _Var5._M_p = pTVar2[uVar6].str._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_310,_Var5._M_p,_Var5._M_p + pTVar2[uVar6].str._M_string_length);
  local_2f0._0_8_ = local_2f0 + 0x10;
  pcVar3 = (bi->sLabel)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,pcVar3,pcVar3 + (bi->sLabel)._M_string_length);
  pcVar3 = (bi->eLabel)._M_dataplus._M_p;
  local_2d0._M_p = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar3,pcVar3 + (bi->eLabel)._M_string_length);
  uVar6 = _add_expr(this,uVar6,(BlockInfo *)local_2f0);
  if (local_2d0._M_p != local_2c0) {
    operator_delete(local_2d0._M_p);
  }
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    operator_delete((void *)local_2f0._0_8_);
  }
  if (-1 < (int)uVar6) {
    uVar4 = uVar6;
    switch(TVar1) {
    case equal:
      paVar7 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"eq","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,anon_var_dwarf_16623 + 0x22);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_90,&local_b0,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      _Var5._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
        _Var5._M_p = local_90._M_dataplus._M_p;
      }
      break;
    case not_equal:
      paVar7 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"neq","");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,anon_var_dwarf_16623 + 0x22);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_f0,&local_110,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      _Var5._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
        _Var5._M_p = local_f0._M_dataplus._M_p;
      }
      break;
    case less_than:
      puts("lt!!");
      paVar7 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"lt","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,anon_var_dwarf_16623 + 0x22);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_150,&local_170,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      _Var5._M_p = local_150._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
        _Var5._M_p = local_150._M_dataplus._M_p;
      }
      break;
    case less_than_equal:
      puts("lte!!");
      paVar7 = &local_1b0.field_2;
      local_1b0._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"lte","");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,anon_var_dwarf_16623 + 0x22);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_1b0,&local_1d0,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      _Var5._M_p = local_1b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
        _Var5._M_p = local_1b0._M_dataplus._M_p;
      }
      break;
    case greater_than:
      paVar7 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"gt","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,anon_var_dwarf_16623 + 0x22);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_210,&local_230,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      _Var5._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
        _Var5._M_p = local_210._M_dataplus._M_p;
      }
      break;
    case greater_than_equal:
      paVar7 = &local_270.field_2;
      local_270._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"gte","");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,anon_var_dwarf_16623 + 0x22);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_270,&local_290,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      _Var5._M_p = local_270._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
        _Var5._M_p = local_270._M_dataplus._M_p;
      }
      break;
    default:
      goto switchD_0010cd70_default;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar7) {
      operator_delete(_Var5._M_p);
    }
  }
switchD_0010cd70_default:
  if (local_310[0] != local_300) {
    operator_delete(local_310[0]);
  }
LAB_0010d227:
  if (local_330[0] != local_320) {
    operator_delete(local_330[0]);
  }
  return uVar4;
}

Assistant:

int KParser::_cmp_expr(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    std::string leftValue = m_tokens[i].str;
    t = _add_expr(i, bi);
    if (t < 0) {
        return -1;
    }
    i = t;

    do {
        int tryI = i;
        auto tokenValue = m_tokens[tryI].tokenType;
        if(tokenValue != TokenType::equal 
           && tokenValue != TokenType::not_equal
           && tokenValue != TokenType::less_than
           && tokenValue != TokenType::less_than_equal
           && tokenValue != TokenType::greater_than
           && tokenValue != TokenType::greater_than_equal
           ) {
            break;
        }
        tryI++;
        std::string rightValue = m_tokens[tryI].str;
        t = _add_expr(tryI, bi);
        if (t < 0) {
            break;
        }
        // bi.addCode(leftValue);
        // bi.addCode(rightValue);
        if(tokenValue == TokenType::equal) {
            addCode("eq", "", "");
        } else if(tokenValue == TokenType::not_equal) {
            addCode("neq", "", "");
        }else if(tokenValue == TokenType::less_than) {
            printf("lt!!\n");
            addCode("lt", "", "");
        }else if(tokenValue == TokenType::less_than_equal) {
            printf("lte!!\n");
            addCode("lte", "", "");
        }else if(tokenValue == TokenType::greater_than) {
            addCode("gt", "", "");
        }else if(tokenValue == TokenType::greater_than_equal) {
            addCode("gte", "", "");
        } 
        i = t; 
    } while(0);
    return i;
}